

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O1

int secp256k1_borromean_verify
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scalar *evalues,uchar *e0,
              secp256k1_scalar *s,secp256k1_gej *pubs,size_t *rsizes,size_t nrings,uchar *m,
              size_t mlen)

{
  uint64_t *puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  secp256k1_scalar ens;
  size_t size;
  uchar tmp [33];
  secp256k1_sha256 sha256_e0;
  secp256k1_gej rgej;
  secp256k1_ge rge;
  uint local_290;
  uint local_28c;
  int local_288;
  uint local_284;
  uchar *local_280;
  long local_278;
  size_t local_270;
  secp256k1_scalar *local_268;
  secp256k1_scalar local_260;
  secp256k1_scalar *local_240;
  secp256k1_gej *local_238;
  secp256k1_scalar *local_230;
  secp256k1_scalar *local_228;
  secp256k1_gej *local_220;
  secp256k1_ecmult_context *local_218;
  size_t local_210;
  uchar local_208;
  uchar uStack_207;
  uchar uStack_206;
  uchar uStack_205;
  uchar uStack_204;
  uchar uStack_203;
  uchar uStack_202;
  uchar uStack_201;
  uchar uStack_200;
  uchar uStack_1ff;
  uchar uStack_1fe;
  uchar uStack_1fd;
  uchar uStack_1fc;
  uchar uStack_1fb;
  uchar uStack_1fa;
  uchar uStack_1f9;
  uchar local_1f8;
  uchar uStack_1f7;
  uchar uStack_1f6;
  uchar uStack_1f5;
  uchar uStack_1f4;
  uchar uStack_1f3;
  uchar uStack_1f2;
  uchar uStack_1f1;
  uchar uStack_1f0;
  uchar uStack_1ef;
  uchar uStack_1ee;
  uchar uStack_1ed;
  uchar uStack_1ec;
  uchar uStack_1eb;
  uchar uStack_1ea;
  uchar uStack_1e9;
  secp256k1_sha256 local_1d8;
  secp256k1_sha256 local_170;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  local_170.s[0] = 0x6a09e667;
  local_170.s[1] = 0xbb67ae85;
  local_170.s[2] = 0x3c6ef372;
  local_170.s[3] = 0xa54ff53a;
  local_170.s[4] = 0x510e527f;
  local_170.s[5] = 0x9b05688c;
  local_170.s[6] = 0x1f83d9ab;
  local_170.s[7] = 0x5be0cd19;
  local_170.bytes = 0;
  local_268 = evalues;
  local_240 = s;
  local_238 = pubs;
  local_218 = ecmult_ctx;
  if (nrings != 0) {
    local_278 = 0;
    sVar5 = 0;
    local_280 = e0;
    do {
      local_1d8.s[0] = 0x6a09e667;
      local_1d8.s[1] = 0xbb67ae85;
      local_1d8.s[2] = 0x3c6ef372;
      local_1d8.s[3] = 0xa54ff53a;
      local_1d8.s[4] = 0x510e527f;
      local_1d8.s[5] = 0x9b05688c;
      local_1d8.s[6] = 0x1f83d9ab;
      local_1d8.s[7] = 0x5be0cd19;
      local_1d8.bytes = 0;
      uVar2 = (uint)sVar5;
      local_28c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      local_290 = 0;
      local_284 = local_28c;
      secp256k1_sha256_write(&local_1d8,local_280,0x20);
      secp256k1_sha256_write(&local_1d8,m,mlen);
      secp256k1_sha256_write(&local_1d8,(uchar *)&local_28c,4);
      secp256k1_sha256_write(&local_1d8,(uchar *)&local_290,4);
      secp256k1_sha256_finalize(&local_1d8,&local_208);
      secp256k1_scalar_set_b32(&local_260,&local_208,&local_288);
      if (rsizes[sVar5] != 0) {
        local_228 = local_240 + local_278;
        local_220 = local_238 + local_278;
        local_230 = local_268 + local_278;
        lVar3 = 0;
        lVar4 = 0;
        uVar6 = 0;
        local_270 = sVar5;
        do {
          if (local_288 != 0) {
            return 0;
          }
          if (((*(long *)((long)local_228->d + lVar4 + 8) == 0 &&
               *(long *)((long)local_228->d + lVar4) == 0) &&
              *(long *)((long)local_228->d + lVar4 + 0x10) == 0) &&
              *(long *)((long)local_228->d + lVar4 + 0x18) == 0) {
            return 0;
          }
          if (((local_260.d[1] == 0 && local_260.d[0] == 0) && local_260.d[2] == 0) &&
              local_260.d[3] == 0) {
            return 0;
          }
          if (*(int *)((long)(&local_220->z + 1) + lVar4 * 4) != 0) {
            return 0;
          }
          if (local_268 != (secp256k1_scalar *)0x0) {
            puVar1 = (uint64_t *)((long)local_230->d + lVar4 + 0x10);
            *puVar1 = local_260.d[2];
            puVar1[1] = local_260.d[3];
            puVar1 = (uint64_t *)((long)local_230->d + lVar4);
            *puVar1 = local_260.d[0];
            puVar1[1] = local_260.d[1];
          }
          secp256k1_ecmult(local_218,&local_108,(secp256k1_gej *)((long)(local_220->x).n + lVar3),
                           &local_260,(secp256k1_scalar *)((long)local_228->d + lVar4));
          if (local_108.infinity != 0) {
            return 0;
          }
          secp256k1_ge_set_gej_var(&local_88,&local_108);
          secp256k1_eckey_pubkey_serialize(&local_88,&local_208,&local_210,1);
          sVar5 = local_270;
          if (uVar6 == rsizes[local_270] - 1) {
            secp256k1_sha256_write(&local_170,&local_208,local_210);
          }
          else {
            local_1d8.s[0] = 0x6a09e667;
            local_1d8.s[1] = 0xbb67ae85;
            local_1d8.s[2] = 0x3c6ef372;
            local_1d8.s[3] = 0xa54ff53a;
            local_1d8.s[4] = 0x510e527f;
            local_1d8.s[5] = 0x9b05688c;
            local_1d8.s[6] = 0x1f83d9ab;
            local_1d8.s[7] = 0x5be0cd19;
            local_1d8.bytes = 0;
            local_28c = local_284;
            uVar2 = (int)uVar6 + 1;
            local_290 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 * 0x1000000;
            secp256k1_sha256_write(&local_1d8,&local_208,0x21);
            secp256k1_sha256_write(&local_1d8,m,mlen);
            secp256k1_sha256_write(&local_1d8,(uchar *)&local_28c,4);
            secp256k1_sha256_write(&local_1d8,(uchar *)&local_290,4);
            secp256k1_sha256_finalize(&local_1d8,&local_208);
            secp256k1_scalar_set_b32(&local_260,&local_208,&local_288);
          }
          uVar6 = uVar6 + 1;
          lVar4 = lVar4 + 0x20;
          lVar3 = lVar3 + 0x80;
        } while (uVar6 < rsizes[sVar5]);
        local_278 = local_278 + uVar6;
        sVar5 = local_270;
      }
      sVar5 = sVar5 + 1;
      e0 = local_280;
    } while (sVar5 != nrings);
  }
  secp256k1_sha256_write(&local_170,m,mlen);
  secp256k1_sha256_finalize(&local_170,&local_208);
  auVar7[0] = -(e0[0x10] == local_1f8);
  auVar7[1] = -(e0[0x11] == uStack_1f7);
  auVar7[2] = -(e0[0x12] == uStack_1f6);
  auVar7[3] = -(e0[0x13] == uStack_1f5);
  auVar7[4] = -(e0[0x14] == uStack_1f4);
  auVar7[5] = -(e0[0x15] == uStack_1f3);
  auVar7[6] = -(e0[0x16] == uStack_1f2);
  auVar7[7] = -(e0[0x17] == uStack_1f1);
  auVar7[8] = -(e0[0x18] == uStack_1f0);
  auVar7[9] = -(e0[0x19] == uStack_1ef);
  auVar7[10] = -(e0[0x1a] == uStack_1ee);
  auVar7[0xb] = -(e0[0x1b] == uStack_1ed);
  auVar7[0xc] = -(e0[0x1c] == uStack_1ec);
  auVar7[0xd] = -(e0[0x1d] == uStack_1eb);
  auVar7[0xe] = -(e0[0x1e] == uStack_1ea);
  auVar7[0xf] = -(e0[0x1f] == uStack_1e9);
  auVar8[0] = -(*e0 == local_208);
  auVar8[1] = -(e0[1] == uStack_207);
  auVar8[2] = -(e0[2] == uStack_206);
  auVar8[3] = -(e0[3] == uStack_205);
  auVar8[4] = -(e0[4] == uStack_204);
  auVar8[5] = -(e0[5] == uStack_203);
  auVar8[6] = -(e0[6] == uStack_202);
  auVar8[7] = -(e0[7] == uStack_201);
  auVar8[8] = -(e0[8] == uStack_200);
  auVar8[9] = -(e0[9] == uStack_1ff);
  auVar8[10] = -(e0[10] == uStack_1fe);
  auVar8[0xb] = -(e0[0xb] == uStack_1fd);
  auVar8[0xc] = -(e0[0xc] == uStack_1fc);
  auVar8[0xd] = -(e0[0xd] == uStack_1fb);
  auVar8[0xe] = -(e0[0xe] == uStack_1fa);
  auVar8[0xf] = -(e0[0xf] == uStack_1f9);
  auVar8 = auVar8 & auVar7;
  return (uint)((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff);
}

Assistant:

int secp256k1_borromean_verify(const secp256k1_ecmult_context* ecmult_ctx, secp256k1_scalar *evalues, const unsigned char *e0,
 const secp256k1_scalar *s, const secp256k1_gej *pubs, const size_t *rsizes, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    count = 0;
    secp256k1_sha256_initialize(&sha256_e0);
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        for (j = 0; j < rsizes[i]; j++) {
            if (overflow || secp256k1_scalar_is_zero(&s[count]) || secp256k1_scalar_is_zero(&ens) || secp256k1_gej_is_infinity(&pubs[count])) {
                return 0;
            }
            if (evalues) {
                /*If requested, save the challenges for proof rewind.*/
                evalues[count] = ens;
            }
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count], &ens, &s[count]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            /* OPT: loop can be hoisted and split to use batch inversion across all the rings; this would make it much faster. */
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            if (j != rsizes[i] - 1) {
                secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
                secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            } else {
                secp256k1_sha256_write(&sha256_e0, tmp, size);
            }
            count++;
        }
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, tmp);
    return memcmp(e0, tmp, 32) == 0;
}